

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_quantization_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  AV1RawSequenceHeader *pAVar1;
  RK_U8 RVar2;
  RK_S32 RVar3;
  RK_U32 value;
  RK_U8 local_2c [4];
  
  pAVar1 = ctx->sequence_header;
  RVar3 = mpp_av1_read_unsigned(gb,8,"base_q_idx",(RK_U32 *)local_2c,0,0xff);
  if (RVar3 < 0) {
    return RVar3;
  }
  current->base_q_idx = local_2c[0];
  RVar3 = mpp_av1_read_unsigned(gb,1,"delta_q_y_dc.delta_coded",(RK_U32 *)local_2c,0,1);
  if (RVar3 < 0) {
    return -1;
  }
  if (local_2c[0] == '\0') {
    RVar2 = '\0';
  }
  else {
    RVar3 = mpp_av1_read_signed(gb,7,"delta_q_y_dc.delta_q",(RK_S32 *)local_2c,-0x40,0x3f);
    RVar2 = local_2c[0];
    if (RVar3 < 0) {
      return -1;
    }
  }
  current->delta_q_y_dc = RVar2;
  if (ctx->num_planes < 2) {
    current->delta_q_u_dc = '\0';
    current->delta_q_u_ac = '\0';
    current->delta_q_v_dc = '\0';
    current->delta_q_v_ac = '\0';
  }
  else {
    if ((pAVar1->color_config).separate_uv_delta_q == '\0') {
      current->diff_uv_delta = '\0';
    }
    else {
      RVar3 = mpp_av1_read_unsigned(gb,1,"diff_uv_delta",(RK_U32 *)local_2c,0,1);
      if (RVar3 < 0) {
        return -1;
      }
      current->diff_uv_delta = local_2c[0];
    }
    RVar3 = mpp_av1_read_unsigned(gb,1,"delta_q_u_dc.delta_coded",(RK_U32 *)local_2c,0,1);
    if (RVar3 < 0) {
      return -1;
    }
    if (local_2c[0] == '\0') {
      RVar2 = '\0';
    }
    else {
      RVar3 = mpp_av1_read_signed(gb,7,"delta_q_u_dc.delta_q",(RK_S32 *)local_2c,-0x40,0x3f);
      RVar2 = local_2c[0];
      if (RVar3 < 0) {
        return -1;
      }
    }
    current->delta_q_u_dc = RVar2;
    RVar3 = mpp_av1_read_unsigned(gb,1,"delta_q_u_ac.delta_coded",(RK_U32 *)local_2c,0,1);
    if (RVar3 < 0) {
      return -1;
    }
    if (local_2c[0] == '\0') {
      RVar2 = '\0';
    }
    else {
      RVar3 = mpp_av1_read_signed(gb,7,"delta_q_u_ac.delta_q",(RK_S32 *)local_2c,-0x40,0x3f);
      RVar2 = local_2c[0];
      if (RVar3 < 0) {
        return -1;
      }
    }
    current->delta_q_u_ac = RVar2;
    if (current->diff_uv_delta == '\0') {
      current->delta_q_v_dc = current->delta_q_u_dc;
    }
    else {
      RVar3 = mpp_av1_read_unsigned(gb,1,"delta_q_v_dc.delta_coded",(RK_U32 *)local_2c,0,1);
      if (RVar3 < 0) {
        return -1;
      }
      if (local_2c[0] == '\0') {
        RVar2 = '\0';
      }
      else {
        RVar3 = mpp_av1_read_signed(gb,7,"delta_q_v_dc.delta_q",(RK_S32 *)local_2c,-0x40,0x3f);
        RVar2 = local_2c[0];
        if (RVar3 < 0) {
          return -1;
        }
      }
      current->delta_q_v_dc = RVar2;
      RVar3 = mpp_av1_read_unsigned(gb,1,"delta_q_v_ac.delta_coded",(RK_U32 *)local_2c,0,1);
      if (RVar3 < 0) {
        return -1;
      }
      if (local_2c[0] == '\0') {
        RVar2 = '\0';
      }
      else {
        RVar3 = mpp_av1_read_signed(gb,7,"delta_q_v_ac.delta_q",(RK_S32 *)local_2c,-0x40,0x3f);
        RVar2 = local_2c[0];
        if (RVar3 < 0) {
          return -1;
        }
      }
    }
    current->delta_q_v_ac = RVar2;
  }
  RVar3 = mpp_av1_read_unsigned(gb,1,"using_qmatrix",(RK_U32 *)local_2c,0,1);
  if (-1 < RVar3) {
    current->using_qmatrix = local_2c[0];
    if (local_2c[0] == '\0') {
      return 0;
    }
    RVar3 = mpp_av1_read_unsigned(gb,4,"qm_y",(RK_U32 *)local_2c,0,0xf);
    if (-1 < RVar3) {
      current->qm_y = local_2c[0];
      RVar3 = mpp_av1_read_unsigned(gb,4,"qm_u",(RK_U32 *)local_2c,0,0xf);
      if (-1 < RVar3) {
        current->qm_u = local_2c[0];
        if ((pAVar1->color_config).separate_uv_delta_q == '\0') {
          current->qm_v = local_2c[0];
          return 0;
        }
        RVar3 = mpp_av1_read_unsigned(gb,4,"qm_v",(RK_U32 *)local_2c,0,0xf);
        if (-1 < RVar3) {
          current->qm_v = local_2c[0];
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

static RK_S32 mpp_av1_quantization_params(AV1Context *ctx, BitReadCtx_t *gb,
                                          AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 err;

    fb(8, base_q_idx);

    delta_q(delta_q_y_dc);

    if (ctx->num_planes > 1) {
        if (seq->color_config.separate_uv_delta_q)
            flag(diff_uv_delta);
        else
            infer(diff_uv_delta, 0);

        delta_q(delta_q_u_dc);
        delta_q(delta_q_u_ac);

        if (current->diff_uv_delta) {
            delta_q(delta_q_v_dc);
            delta_q(delta_q_v_ac);
        } else {
            infer(delta_q_v_dc, current->delta_q_u_dc);
            infer(delta_q_v_ac, current->delta_q_u_ac);
        }
    } else {
        infer(delta_q_u_dc, 0);
        infer(delta_q_u_ac, 0);
        infer(delta_q_v_dc, 0);
        infer(delta_q_v_ac, 0);
    }

    flag(using_qmatrix);
    if (current->using_qmatrix) {
        fb(4, qm_y);
        fb(4, qm_u);
        if (seq->color_config.separate_uv_delta_q)
            fb(4, qm_v);
        else
            infer(qm_v, current->qm_u);
    }

    return 0;
}